

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float32 float32_muladd_x86_64(float32 xa,float32 xb,float32 xc,int flags,float_status *s)

{
  float32 fVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  float fVar9;
  float __z;
  
  bVar2 = s->float_exception_flags;
  if ((((bVar2 & 0x20) != 0) && ((flags & 8U) == 0)) && (s->float_rounding_mode == '\0')) {
    if (s->flush_inputs_to_zero != '\0') {
      bVar3 = (xa & 0x7f800000) == 0;
      bVar4 = (xa & 0x7fffffff) != 0;
      if (bVar4 && bVar3) {
        xa = xa & 0x80000000;
        bVar2 = bVar2 | 0x40;
      }
      bVar5 = (xb & 0x7f800000) == 0;
      bVar6 = (xb & 0x7fffffff) != 0;
      if (bVar6 && bVar5) {
        xb = xb & 0x80000000;
        bVar2 = bVar2 | 0x40;
      }
      bVar7 = (xc & 0x7f800000) == 0;
      bVar8 = (xc & 0x7fffffff) != 0;
      if (bVar8 && bVar7) {
        xc = xc & 0x80000000;
        bVar2 = bVar2 | 0x40;
      }
      if ((bVar4 && bVar3 || bVar6 && bVar5) || bVar8 && bVar7) {
        s->float_exception_flags = bVar2;
      }
    }
    if ((((ABS((float)xa) == 0.0) || (((xa >> 0x17) + 1 & 0xfe) != 0)) &&
        ((ABS((float)xb) == 0.0 || (((xb >> 0x17) + 1 & 0xfe) != 0)))) &&
       ((ABS((float)xc) == 0.0 || (((xc >> 0x17) + 1 & 0xfe) != 0)))) {
      if (ABS((float)xa) == 0.0 || ABS((float)xb) == 0.0) {
        if (SUB41((flags & 2U) >> 1,0) == (int)(xb ^ xa) < 0) {
          fVar9 = 0.0;
        }
        else {
          fVar9 = -0.0;
        }
        if ((flags & 1U) != 0) {
          xc = (float32)-(float)xc;
        }
        fVar9 = (float)xc + fVar9;
      }
      else {
        fVar9 = (float)xa;
        if ((flags & 2U) != 0) {
          fVar9 = -(float)xa;
        }
        __z = (float)xc;
        if ((flags & 1U) != 0) {
          __z = -(float)xc;
        }
        fVar9 = fmaf(fVar9,(float)xb,__z);
        if (ABS(fVar9) == INFINITY) {
          s->float_exception_flags = bVar2 | 8;
        }
        else if ((float)((uint)fVar9 & (uint)DAT_00d59010) <= 1.1754944e-38) goto LAB_004d9d8c;
      }
      if ((flags & 4U) != 0) {
        fVar9 = (float)((uint)fVar9 ^ (uint)DAT_00d58680);
      }
      return (float32)fVar9;
    }
  }
LAB_004d9d8c:
  fVar1 = soft_f32_muladd(xa,xb,xc,flags,s);
  return fVar1;
}

Assistant:

float32 QEMU_FLATTEN
float32_muladd(float32 xa, float32 xb, float32 xc, int flags, float_status *s)
{
    union_float32 ua, ub, uc, ur;

    ua.s = xa;
    ub.s = xb;
    uc.s = xc;

    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }
    if (unlikely(flags & float_muladd_halve_result)) {
        goto soft;
    }

    float32_input_flush3(&ua.s, &ub.s, &uc.s, s);
    if (unlikely(!f32_is_zon3(ua, ub, uc))) {
        goto soft;
    }

    if (unlikely(force_soft_fma)) {
        goto soft;
    }

    /*
     * When (a || b) == 0, there's no need to check for under/over flow,
     * since we know the addend is (normal || 0) and the product is 0.
     */
    if (float32_is_zero(ua.s) || float32_is_zero(ub.s)) {
        union_float32 up;
        bool prod_sign;

        prod_sign = float32_is_neg(ua.s) ^ float32_is_neg(ub.s);
        prod_sign ^= !!(flags & float_muladd_negate_product);
        up.s = float32_set_sign(float32_zero, prod_sign);

        if (flags & float_muladd_negate_c) {
            uc.h = -uc.h;
        }
        ur.h = up.h + uc.h;
    } else {
        union_float32 ua_orig = ua;
        union_float32 uc_orig = uc;

        if (flags & float_muladd_negate_product) {
            ua.h = -ua.h;
        }
        if (flags & float_muladd_negate_c) {
            uc.h = -uc.h;
        }

        ur.h = fmaf(ua.h, ub.h, uc.h);

        if (unlikely(f32_is_inf(ur))) {
            s->float_exception_flags |= float_flag_overflow;
        } else if (unlikely(fabsf(ur.h) <= FLT_MIN)) {
            ua = ua_orig;
            uc = uc_orig;
            goto soft;
        }
    }
    if (flags & float_muladd_negate_result) {
        return float32_chs(ur.s);
    }
    return ur.s;

 soft:
    return soft_f32_muladd(ua.s, ub.s, uc.s, flags, s);
}